

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall
wabt::(anonymous_namespace)::CWriter::
Write<char_const*&,char_const(&)[2],wabt::(anonymous_namespace)::ExternalInstancePtr,char_const(&)[9],wabt::(anonymous_namespace)::StackVar,char_const(&)[2]>
          (CWriter *this,char **t,char (*u) [2],ExternalInstancePtr *args,char (*args_1) [9],
          StackVar *args_2,char (*args_3) [2])

{
  string_view local_58;
  string_view local_48;
  StackVar *local_38;
  StackVar *args_local_2;
  char (*args_local_1) [9];
  ExternalInstancePtr *args_local;
  char (*u_local) [2];
  char **t_local;
  CWriter *this_local;
  
  local_38 = args_2;
  args_local_2 = (StackVar *)args_1;
  args_local_1 = (char (*) [9])args;
  args_local = (ExternalInstancePtr *)u;
  u_local = (char (*) [2])t;
  t_local = (char **)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,*t);
  anon_unknown_0::CWriter::Write((CWriter *)this,local_48);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_58,(char *)args_local);
  anon_unknown_0::CWriter::Write((CWriter *)this,local_58);
  Write<wabt::(anonymous_namespace)::ExternalInstancePtr,char_const(&)[9],wabt::(anonymous_namespace)::StackVar,char_const(&)[2]>
            (this,(ExternalInstancePtr *)args_local_1,(char (*) [9])args_local_2,local_38,args_3);
  return;
}

Assistant:

void Write(T&& t, U&& u, Args&&... args) {
    Write(std::forward<T>(t));
    Write(std::forward<U>(u));
    Write(std::forward<Args>(args)...);
  }